

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O2

void __thiscall
duckdb::CopyToFunctionLocalState::FlushPartitions
          (CopyToFunctionLocalState *this,ExecutionContext *context,PhysicalCopyToFile *op,
          CopyToFunctionGlobalState *g)

{
  unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>,_true>
  *this_00;
  copy_to_initialize_local_t p_Var1;
  copy_to_sink_t p_Var2;
  copy_to_combine_t p_Var3;
  ClientContext *pCVar4;
  bool bVar5;
  pointer pHVar6;
  type state;
  iterator iVar7;
  reference this_01;
  pointer this_02;
  DataChunk *source;
  type pFVar8;
  type pGVar9;
  type pLVar10;
  __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  *this_03;
  map<unsigned_long,_const_duckdb::HivePartitionKey_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>_>_>
  partition_key_map;
  DataChunk filtered_chunk;
  ColumnDataChunkIterator __end3;
  ColumnDataChunkIterator __begin3;
  ExecutionContext local_250;
  PartitionWriteInfo *local_238;
  ulong local_230;
  vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
  *local_228;
  CopyToFunctionGlobalState *local_220;
  CopyToFunctionLocalState *local_218;
  vector<unsigned_long,_true> *local_210;
  vector<duckdb::LogicalType,_true> *local_208;
  ColumnDataChunkIterationHelper local_200;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>_>_>
  local_1e0;
  DataChunk local_1b0;
  ColumnDataChunkIterator local_170;
  ColumnDataChunkIterator local_d0;
  
  if ((this->part_buffer).
      super_unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::HivePartitionedColumnData_*,_std::default_delete<duckdb::HivePartitionedColumnData>_>
      .super__Head_base<0UL,_duckdb::HivePartitionedColumnData_*,_false>._M_head_impl !=
      (HivePartitionedColumnData *)0x0) {
    this_00 = &this->part_buffer;
    local_250.thread = (ThreadContext *)context;
    local_220 = g;
    pHVar6 = unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>,_true>
             ::operator->(this_00);
    local_218 = this;
    state = unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>
            ::operator*(&this->part_buffer_append_state);
    PartitionedColumnData::FlushAppendState(&pHVar6->super_PartitionedColumnData,state);
    pHVar6 = unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>,_true>
             ::operator->(this_00);
    local_228 = PartitionedColumnData::GetPartitions(&pHVar6->super_PartitionedColumnData);
    pHVar6 = unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>,_true>
             ::operator->(this_00);
    HivePartitionedColumnData::GetReverseMap
              ((map<unsigned_long,_const_duckdb::HivePartitionKey_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>_>_>
                *)&local_1e0,pHVar6);
    local_250.pipeline.ptr = (Pipeline *)&op->bind_data;
    local_208 = &op->expected_types;
    local_210 = &op->partition_columns;
    for (local_230 = 0;
        local_230 <
        (ulong)((long)(local_228->
                      super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_228->
                      super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3); local_230 = local_230 + 1) {
      iVar7 = ::std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>_>_>
              ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>_>_>
                      *)&local_1e0,&local_230);
      if ((_Rb_tree_header *)iVar7._M_node != &local_1e0._M_impl.super__Rb_tree_header) {
        local_238 = CopyToFunctionGlobalState::GetPartitionWriteInfo
                              (local_220,(ExecutionContext *)local_250.thread,op,
                               (vector<duckdb::Value,_true> *)iVar7._M_node[1]._M_parent);
        p_Var1 = (op->function).copy_to_initialize_local;
        unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator*
                  ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                    *)local_250.pipeline.ptr);
        (*p_Var1)(&local_250,(FunctionData *)local_250.thread);
        this_01 = vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
                  ::get<true>(local_228,local_230);
        this_02 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                  ::operator->(this_01);
        ColumnDataCollection::Chunks(&local_200,this_02);
        ColumnDataChunkIterationHelper::begin(&local_d0,&local_200);
        ColumnDataChunkIterationHelper::end(&local_170,&local_200);
        while( true ) {
          bVar5 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                            (&local_d0,&local_170);
          if (!bVar5) break;
          source = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(&local_d0);
          if (op->write_partition_columns == true) {
            p_Var2 = (op->function).copy_to_sink;
            pFVar8 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                     ::operator*((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                                  *)local_250.pipeline.ptr);
            pGVar9 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                     ::operator*(&local_238->global_state);
            pLVar10 = unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
                      ::operator*((unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
                                   *)&local_250);
            (*p_Var2)((ExecutionContext *)local_250.thread,pFVar8,pGVar9,pLVar10,source);
          }
          else {
            DataChunk::DataChunk(&local_1b0);
            SetDataWithoutPartitions(local_218,&local_1b0,source,local_208,local_210);
            p_Var2 = (op->function).copy_to_sink;
            pFVar8 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                     ::operator*((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                                  *)local_250.pipeline.ptr);
            pGVar9 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                     ::operator*(&local_238->global_state);
            pLVar10 = unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
                      ::operator*((unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
                                   *)&local_250);
            (*p_Var2)((ExecutionContext *)local_250.thread,pFVar8,pGVar9,pLVar10,&local_1b0);
            DataChunk::~DataChunk(&local_1b0);
          }
          ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(&local_d0);
        }
        ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator
                  (&local_170);
        ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&local_d0)
        ;
        ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &local_200.column_ids);
        p_Var3 = (op->function).copy_to_combine;
        pFVar8 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
                 operator*((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                            *)local_250.pipeline.ptr);
        pGVar9 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                 ::operator*(&local_238->global_state);
        pLVar10 = unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
                  ::operator*((unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
                               *)&local_250);
        (*p_Var3)((ExecutionContext *)local_250.thread,pFVar8,pGVar9,pLVar10);
        pCVar4 = local_250.client;
        local_250.client = (ClientContext *)0x0;
        if (pCVar4 != (ClientContext *)0x0) {
          (*(code *)(((pCVar4->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                      internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                    internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)();
        }
        this_03 = (__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                   *)vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
                     ::get<true>(local_228,local_230);
        ::std::
        __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
        ::reset(this_03,(pointer)0x0);
        CopyToFunctionGlobalState::FinishPartitionWrite(local_220,local_238);
        if (local_250.client != (ClientContext *)0x0) {
          (*(code *)((((local_250.client)->super_enable_shared_from_this<duckdb::ClientContext>).
                      __weak_this_.internal.
                      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)();
        }
      }
    }
    ResetAppendState(local_218);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>_>_>
    ::~_Rb_tree(&local_1e0);
  }
  return;
}

Assistant:

void FlushPartitions(ExecutionContext &context, const PhysicalCopyToFile &op, CopyToFunctionGlobalState &g) {
		if (!part_buffer) {
			return;
		}
		part_buffer->FlushAppendState(*part_buffer_append_state);
		auto &partitions = part_buffer->GetPartitions();
		auto partition_key_map = part_buffer->GetReverseMap();

		for (idx_t i = 0; i < partitions.size(); i++) {
			auto entry = partition_key_map.find(i);
			if (entry == partition_key_map.end()) {
				continue;
			}
			// get the partition write info for this buffer
			auto &info = g.GetPartitionWriteInfo(context, op, entry->second->values);

			auto local_copy_state = op.function.copy_to_initialize_local(context, *op.bind_data);
			// push the chunks into the write state
			for (auto &chunk : partitions[i]->Chunks()) {
				if (op.write_partition_columns) {
					op.function.copy_to_sink(context, *op.bind_data, *info.global_state, *local_copy_state, chunk);
				} else {
					DataChunk filtered_chunk;
					SetDataWithoutPartitions(filtered_chunk, chunk, op.expected_types, op.partition_columns);
					op.function.copy_to_sink(context, *op.bind_data, *info.global_state, *local_copy_state,
					                         filtered_chunk);
				}
			}
			op.function.copy_to_combine(context, *op.bind_data, *info.global_state, *local_copy_state);
			local_copy_state.reset();
			partitions[i].reset();
			g.FinishPartitionWrite(info);
		}
		ResetAppendState();
	}